

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O2

void printfmt<int,std::__cxx11::string>
               (ostream *out,char *format,int *arg,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  char cVar1;
  char *format_00;
  
  format_00 = format + 2;
  do {
    cVar1 = format_00[-2];
    if (cVar1 == '{') {
      if (format_00[-1] == '}') {
        print<int>(out,arg);
        printfmt<std::__cxx11::string>(out,format_00,args);
        return;
      }
    }
    else if (cVar1 == '\0') {
      return;
    }
    std::operator<<(out,cVar1);
    format_00 = format_00 + 1;
  } while( true );
}

Assistant:

inline void printfmt(std::ostream& out, const char *format, const T& arg, const Args&... args) {
    char* s = const_cast<char*>(format);
    for (unsigned char ch; (ch = *s) != '\0'; out << *s++) {
        if (ch == '{' && *(s+1) == '}') {
            print(out, arg);
            printfmt(out, s+2, args...);
            break;
        }
    }
}